

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coroutine.hpp
# Opt level: O2

void __thiscall
henson::Coroutine<henson::PythonPuppet>::~Coroutine(Coroutine<henson::PythonPuppet> *this)

{
  coro_stack_free(&this->stack_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->log_).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Coroutine()
                        {
#ifndef USE_BOOST
                            coro_stack_free(&stack_);
#endif
                        }